

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

string * __thiscall
Fossilize::extract_string_abi_cxx11_
          (string *__return_storage_ptr__,Fossilize *this,uint32_t *words,uint32_t num_words)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = 0;
  do {
    if (uVar2 == ((ulong)words & 0xffffffff)) {
      return __return_storage_ptr__;
    }
    uVar3 = *(uint *)(this + uVar2 * 4);
    iVar1 = 4;
    while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
      if ((char)uVar3 == '\0') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar3 = uVar3 >> 8;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static std::string extract_string(const uint32_t *words, uint32_t num_words)
{
	std::string ret;
	for (uint32_t i = 0; i < num_words; i++)
	{
		uint32_t w = words[i];

		for (uint32_t j = 0; j < 4; j++, w >>= 8)
		{
			auto c = char(w & 0xff);
			if (c == '\0')
				return ret;
			ret += c;
		}
	}
	return ret;
}